

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  allocator_type local_51;
  ExpectationBase *next;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  next = this;
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector(&expectations,1,&next,&local_51);
  while( true ) {
    ppEVar3 = expectations.
              super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar2 = expectations.
              super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (expectations.
        super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        expectations.
        super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    pEVar1 = expectations.
             super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    expectations.
    super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         expectations.
         super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    for (p_Var5 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      next = *(ExpectationBase **)(p_Var5 + 1);
      bVar4 = IsSatisfied(next);
      if (!bVar4) goto LAB_001f4b52;
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::push_back(&expectations,&next);
    }
  }
LAB_001f4b52:
  std::
  _Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::~_Vector_base(&expectations.
                   super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 );
  return ppEVar2 == ppEVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}